

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall wasm::DataFlow::Printer::warnOnSuspiciousValues(Printer *this,Node *node)

{
  pointer ppNVar1;
  Node *node_00;
  Function *pFVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer ppNVar8;
  Name name;
  
  iVar4 = debug();
  if (iVar4 == 0) {
    __assert_fail("debug()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x2a5,"void wasm::DataFlow::Printer::warnOnSuspiciousValues(Node *)");
  }
  ppNVar8 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while (ppNVar8 != ppNVar1) {
    node_00 = *ppNVar8;
    pNVar5 = getMaybeReplaced(this,node_00);
    ppNVar8 = ppNVar8 + 1;
    if (node_00 != pNVar5) {
      return;
    }
  }
  bVar3 = allInputsIdentical(node);
  if (bVar3) {
    pcVar7 = "^^ suspicious identical inputs! missing optimization in ";
  }
  else {
    if (node->type == Phi) {
      return;
    }
    bVar3 = allInputsConstant(node);
    if (!bVar3) {
      return;
    }
    pcVar7 = "^^ suspicious constant inputs! missing optimization in ";
  }
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar7);
  pFVar2 = this->graph->func;
  name.super_IString.str._M_str = (char *)pFVar2;
  name.super_IString.str._M_len =
       (size_t)(pFVar2->super_Importable).super_Named.name.super_IString.str._M_str;
  poVar6 = wasm::operator<<((wasm *)poVar6,
                            (ostream *)
                            (pFVar2->super_Importable).super_Named.name.super_IString.str._M_len,
                            name);
  std::operator<<(poVar6,"? ^^\n");
  return;
}

Assistant:

void warnOnSuspiciousValues(Node* node) {
    assert(debug());
    // If the node has no uses, it's not interesting enough to be
    // suspicious. TODO
    // If an input was replaced with a var, then we should not
    // look into it, it's not suspiciously trivial.
    for (auto* value : node->values) {
      if (value != getMaybeReplaced(value)) {
        return;
      }
    }
    if (allInputsIdentical(node)) {
      std::cout << "^^ suspicious identical inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
    if (!node->isPhi() && allInputsConstant(node)) {
      std::cout << "^^ suspicious constant inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
  }